

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

void Cba_ManBoxNumRec_rec(Cba_Ntk_t *p,int *pCountP,int *pCountU)

{
  Vec_Int_t *p_00;
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  Cba_Ntk_t *p_01;
  
  iVar2 = p->Id;
  if (pCountP[iVar2] < 0) {
    pCountU[iVar2] = 0;
    pCountP[iVar2] = 0;
    uVar3 = (p->vObjType).nSize;
    uVar7 = (ulong)uVar3;
    if (1 < (int)uVar3) {
      p_00 = &p->vObjFunc;
      lVar8 = 1;
      do {
        if ((int)uVar7 <= lVar8) goto LAB_003a7e54;
        cVar1 = (p->vObjType).pArray[lVar8];
        if (cVar1 != '\0') {
          if (cVar1 == '\x03') {
            iVar5 = (int)lVar8;
            if ((p->vObjFunc).nSize < 1) {
LAB_003a7d7f:
              p_01 = (Cba_Ntk_t *)0x0;
            }
            else {
              Vec_IntFillExtra(p_00,iVar5 + 1,0);
              if ((p->vObjFunc).nSize <= lVar8) goto LAB_003a7e73;
              iVar4 = (p->vObjFunc).pArray[lVar8];
              if (((long)iVar4 < 1) || ((p->pDesign->vNtks).nSize <= iVar4)) goto LAB_003a7d7f;
              p_01 = (Cba_Ntk_t *)(p->pDesign->vNtks).pArray[iVar4];
            }
            Cba_ManBoxNumRec_rec(p_01,pCountP,pCountU);
            if ((p->vObjType).nSize <= lVar8) {
LAB_003a7e54:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            if (((p->vObjType).pArray[lVar8] == '\x03') && (0 < (p->vObjFunc).nSize)) {
              Vec_IntFillExtra(p_00,iVar5 + 1,0);
              if ((p->vObjFunc).nSize <= lVar8) goto LAB_003a7e73;
              lVar6 = (long)(p->vObjFunc).pArray[lVar8];
            }
            else {
              lVar6 = 0;
            }
            pCountP[iVar2] = pCountP[iVar2] + pCountP[lVar6];
            if ((p->vObjType).nSize <= lVar8) goto LAB_003a7e54;
            if (((p->vObjType).pArray[lVar8] == '\x03') && (0 < (p->vObjFunc).nSize)) {
              Vec_IntFillExtra(p_00,iVar5 + 1,0);
              if ((p->vObjFunc).nSize <= lVar8) {
LAB_003a7e73:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              lVar6 = (long)(p->vObjFunc).pArray[lVar8];
            }
            else {
              lVar6 = 0;
            }
            pCountU[iVar2] = pCountU[lVar6] + pCountU[iVar2] + 1;
          }
          else {
            pCountP[iVar2] = pCountP[iVar2] + 1;
          }
        }
        lVar8 = lVar8 + 1;
        uVar7 = (ulong)(p->vObjType).nSize;
      } while (lVar8 < (long)uVar7);
    }
  }
  return;
}

Assistant:

static inline void Cba_ManBoxNumRec_rec( Cba_Ntk_t * p, int * pCountP, int * pCountU )
{
    int iObj, Id = Cba_NtkId(p);
    if ( pCountP[Id] >= 0 )
        return;
    pCountP[Id] = pCountU[Id] = 0;
    Cba_NtkForEachObj( p, iObj )
    {
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            Cba_ManBoxNumRec_rec( Cba_ObjNtk(p, iObj), pCountP, pCountU );
            pCountP[Id] += pCountP[Cba_ObjNtkId(p, iObj)];
            pCountU[Id] += pCountU[Cba_ObjNtkId(p, iObj)] + 1;
        }
        else
            pCountP[Id] += 1;
    }
}